

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::get_subpass_meta_for_render_pass_hash
          (Impl *this,Hash render_pass_hash,uint32_t subpass,SubpassMeta *meta)

{
  bool bVar1;
  uint uVar2;
  const_iterator cVar3;
  byte bVar4;
  Hash local_18;
  
  local_18 = render_pass_hash;
  cVar3 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->render_pass_hash_to_subpass_meta)._M_h,&local_18);
  if ((cVar3.
       super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (*(uint *)((long)cVar3.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
                      ._M_cur + 0x14) <= subpass)) {
    bVar1 = false;
  }
  else {
    if (subpass < 0x10) {
      uVar2 = *(uint *)((long)cVar3.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
                              ._M_cur + 0x10);
    }
    else {
      uVar2 = *(uint *)(*(long *)((long)cVar3.
                                        super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
                                        ._M_cur + 0x18) + (ulong)(subpass - 0x10 >> 4) * 4);
    }
    bVar4 = (byte)(uVar2 >> ((char)subpass * '\x02' & 0x1fU));
    meta->uses_color = (bool)(bVar4 & 1);
    meta->uses_depth_stencil = (bool)(bVar4 >> 1 & 1);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::get_subpass_meta_for_render_pass_hash(Hash render_pass_hash, uint32_t subpass,
                                                                SubpassMeta *meta) const
{
	auto itr = render_pass_hash_to_subpass_meta.find(render_pass_hash);
	if (itr != render_pass_hash_to_subpass_meta.end() && subpass < itr->second.subpass_count)
	{
		uint32_t mask;
		if (subpass < 16)
			mask = itr->second.embedded >> (2 * subpass);
		else
			mask = itr->second.fallback[(subpass - 16) / 16] >> (2 * (subpass & 15));
		meta->uses_color = (mask & 1) != 0;
		meta->uses_depth_stencil = (mask & 2) != 0;
		return true;
	}
	else
		return false;
}